

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialer.c
# Opt level: O2

int nni_dialer_create_url(nni_dialer **dp,nni_sock *s,nng_url *url)

{
  int iVar1;
  char *url_00;
  nni_sp_tran *tran;
  nni_dialer *d;
  size_t sz;
  
  url_00 = nng_url_scheme(url);
  tran = nni_sp_tran_find(url_00);
  iVar1 = 9;
  if ((tran != (nni_sp_tran *)0x0) && (tran->tran_dialer != (nni_sp_dialer_ops *)0x0)) {
    sz = tran->tran_dialer->d_size + 0x8d0;
    d = (nni_dialer *)nni_zalloc(sz);
    if (d == (nni_dialer *)0x0) {
      iVar1 = 2;
    }
    else {
      iVar1 = nni_url_clone_inline(&d->d_url,url);
      if (iVar1 == 0) {
        iVar1 = nni_dialer_init(d,s,tran);
        if (iVar1 == 0) {
          *dp = d;
          iVar1 = 0;
        }
        else {
          nni_dialer_destroy(d);
        }
      }
      else {
        nni_free(d,sz);
      }
    }
  }
  return iVar1;
}

Assistant:

int
nni_dialer_create_url(nni_dialer **dp, nni_sock *s, const nng_url *url)
{
	nni_sp_tran *tran;
	nni_dialer  *d;
	int          rv;
	size_t       sz;

	if (((tran = nni_sp_tran_find(nng_url_scheme(url))) == NULL) ||
	    (tran->tran_dialer == NULL)) {
		return (NNG_ENOTSUP);
	}
	sz = NNI_ALIGN_UP(sizeof(*d)) + tran->tran_dialer->d_size;
	if ((d = nni_zalloc(sz)) == NULL) {
		return (NNG_ENOMEM);
	}
	if ((rv = nni_url_clone_inline(&d->d_url, url)) != 0) {
		nni_free(d, sz);
		return (rv);
	}
	if ((rv = nni_dialer_init(d, s, tran)) != 0) {
		nni_dialer_destroy(d);
		return (rv);
	}
	*dp = d;
	return (0);
}